

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  cmake *pcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *target;
  string *psVar3;
  pointer pbVar4;
  bool bVar5;
  TargetType TVar6;
  PolicyStatus PVar7;
  ostream *poVar8;
  string *psVar9;
  pointer ppcVar10;
  string *c;
  pointer name;
  bool bVar11;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar12;
  cmGeneratorTarget *te;
  string expectedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  undefined1 local_210 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  undefined1 local_1c8 [32];
  ostringstream e;
  undefined4 local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Elt_pointer local_188;
  __node_base local_180;
  
  expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
  expectedTargets._M_string_length = 0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&missingTargets.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expectedTargets.field_2._M_local_buf[0] = '\0';
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)missingTargets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  targets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  targets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  targets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetTargets(this,&targets);
  pbVar4 = targets.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_210._32_8_ = &this->Exports;
  bVar11 = false;
  for (name = targets.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; name != pbVar4; name = name + 1) {
    te = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &missingTargets,&(this->super_cmExportFileGenerator).Namespace);
    cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_1c8,te);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   (string *)local_1c8);
    std::__cxx11::string::append((string *)&expectedTargets);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::assign((char *)&missingTargets);
    pVar12 = std::
             _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
             ::_M_insert_unique<cmGeneratorTarget*const&>
                       ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                         *)&(this->super_cmExportFileGenerator).ExportedTargets,&te);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar8 = std::operator<<((ostream *)&e,"given target \"");
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(te);
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      std::operator<<(poVar8,"\" more than once.");
      pcVar1 = this->LG->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmMakefile::GetBacktrace((cmMakefile *)local_1c8);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_210,(cmListFileBacktrace *)local_1c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8));
      std::__cxx11::string::~string((string *)local_210);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      goto LAB_0021d222;
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_210._32_8_
               ,&te);
    TVar6 = GetExportTargetType(this,te);
    bVar11 = (bool)(bVar11 | TVar6 == INTERFACE_LIBRARY);
  }
  if (bVar11) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])(this,os,"3.0.0");
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,os,&expectedTargets);
LAB_0021d222:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&targets);
  std::__cxx11::string::~string((string *)&missingTargets);
  std::__cxx11::string::~string((string *)&expectedTargets);
  if (name != pbVar4) {
    return false;
  }
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  missingTargets.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppcVar10 = (this->Exports).
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar2 = (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    bVar11 = ppcVar10 == ppcVar2;
    if (bVar11) break;
    target = *ppcVar10;
    TVar6 = GetExportTargetType(this,target);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
              (this,os,target,(ulong)TVar6);
    cmTarget::AppendBuildInterfaceIncludes(target->Target);
    local_1a0 = 0;
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = &stack0xfffffffffffffe60;
    local_180._M_nxt = (_Hash_node_base *)0x0;
    local_188 = (_Elt_pointer)local_198._8_8_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_INCLUDE_DIRECTORIES",
               (allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_SOURCES",(allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_COMPILE_DEFINITIONS",
               (allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_COMPILE_OPTIONS",(allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_AUTOUIC_OPTIONS",(allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_COMPILE_FEATURES",(allocator<char> *)local_210)
    ;
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_LINK_OPTIONS",(allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_LINK_DIRECTORIES",(allocator<char> *)local_210)
    ;
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_LINK_DEPENDS",(allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,BuildInterface,
               (ImportPropertyMap *)&e,&missingTargets);
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expectedTargets,"INTERFACE_POSITION_INDEPENDENT_CODE",
               (allocator<char> *)local_210);
    cmExportFileGenerator::PopulateInterfaceProperty
              (&this->super_cmExportFileGenerator,&expectedTargets,target,(ImportPropertyMap *)&e);
    std::__cxx11::string::~string((string *)&expectedTargets);
    expectedTargets._M_dataplus._M_p = (pointer)&expectedTargets.field_2;
    expectedTargets._M_string_length = 0;
    expectedTargets.field_2._M_local_buf[0] = '\0';
    bVar5 = cmExportFileGenerator::PopulateExportProperties
                      (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)&e,
                       &expectedTargets);
    if (bVar5) {
      PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
      if ((PVar7 != WARN) &&
         (PVar7 = cmGeneratorTarget::GetPolicyStatusCMP0022(target), PVar7 != OLD)) {
        cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                  (&this->super_cmExportFileGenerator,target,BuildInterface,(ImportPropertyMap *)&e,
                   &missingTargets);
      }
      cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                (&this->super_cmExportFileGenerator,target,(ImportPropertyMap *)&e);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])(this,target,os,&e);
    }
    else {
      pcVar1 = this->LG->GlobalGenerator->CMakeInstance;
      cmMakefile::GetBacktrace((cmMakefile *)local_210);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&expectedTargets,(cmListFileBacktrace *)local_210);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_210 + 8));
    }
    std::__cxx11::string::~string((string *)&expectedTargets);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&e);
    ppcVar10 = ppcVar10 + 1;
    if (!bVar5) goto LAB_0021d63f;
  }
  psVar3 = (this->super_cmExportFileGenerator).Configurations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (this->super_cmExportFileGenerator).Configurations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar3; psVar9 = psVar9 + 1) {
    cmExportFileGenerator::GenerateImportConfig
              (&this->super_cmExportFileGenerator,os,psVar9,&missingTargets);
  }
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os,&missingTargets);
LAB_0021d63f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&missingTargets);
  return bVar11;
}

Assistant:

void cmExportBuildFileGenerator::SetImportLocationProperty(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  if (target->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::string prop = "IMPORTED_OBJECTS";
    prop += suffix;

    // Compute all the object files inside this target and setup
    // IMPORTED_OBJECTS as a list of object files
    std::vector<cmSourceFile const*> objectSources;
    target->GetObjectSources(objectSources, config);
    std::string const obj_dir = target->GetObjectDirectory(config);
    std::vector<std::string> objects;
    for (cmSourceFile const* sf : objectSources) {
      const std::string& obj = target->GetObjectName(sf);
      objects.push_back(obj_dir + obj);
    }

    // Store the property.
    properties[prop] = cmJoin(objects, ";");
  } else {
    // Add the main target file.
    {
      std::string prop = "IMPORTED_LOCATION";
      prop += suffix;
      std::string value;
      if (target->IsAppBundleOnApple()) {
        value =
          target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
      } else {
        value = target->GetFullPath(config,
                                    cmStateEnums::RuntimeBinaryArtifact, true);
      }
      properties[prop] = value;
    }

    // Add the import library for windows DLLs.
    if (target->HasImportLibrary(config) &&
        mf->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
      std::string prop = "IMPORTED_IMPLIB";
      prop += suffix;
      std::string value =
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact);
      target->GetImplibGNUtoMS(config, value, value,
                               "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      properties[prop] = value;
    }
  }
}